

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDynamicStateRSTests.cpp
# Opt level: O0

void __thiscall
vkt::DynamicState::anon_unknown_0::DepthBiasBaseCase::beginRenderPass(DepthBiasBaseCase *this)

{
  undefined1 local_20 [8];
  VkClearColorValue clearColor;
  DepthBiasBaseCase *this_local;
  
  local_20 = (undefined1  [8])0x0;
  clearColor._0_8_ = 0x3f80000000000000;
  clearColor._8_8_ = this;
  beginRenderPassWithClearColor(this,(VkClearColorValue *)local_20);
  return;
}

Assistant:

void beginRenderPass (void)
	{
		const vk::VkClearColorValue clearColor = { { 0.0f, 0.0f, 0.0f, 1.0f } };
		beginRenderPassWithClearColor(clearColor);
	}